

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODCode93Writer.cpp
# Opt level: O3

BitMatrix * __thiscall
ZXing::OneD::Code93Writer::encode
          (BitMatrix *__return_storage_ptr__,Code93Writer *this,wstring *contents_,int width,
          int height)

{
  _Bit_type **pp_Var1;
  wchar_t wVar2;
  size_type sVar3;
  string *psVar4;
  BitMatrix *pBVar5;
  int iVar6;
  void *pvVar7;
  invalid_argument *piVar8;
  long *plVar9;
  long *plVar10;
  char cVar11;
  uint pos;
  uint uVar12;
  size_type sVar13;
  size_t i;
  string *psVar14;
  string contents;
  OneD *local_d0;
  string *local_c8;
  OneD local_c0;
  undefined7 uStack_bf;
  int local_b0;
  int local_ac;
  vector<bool,_std::allocator<bool>_> local_a8;
  Code93Writer *local_80;
  BitMatrix *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  sVar3 = contents_->_M_string_length;
  local_d0 = &local_c0;
  local_c8 = (string *)0x0;
  local_c0 = (OneD)0x0;
  local_b0 = width;
  local_ac = height;
  local_80 = this;
  local_78 = __return_storage_ptr__;
  std::__cxx11::string::reserve((ulong)&local_d0);
  if (sVar3 != 0) {
    sVar13 = 0;
    do {
      wVar2 = (contents_->_M_dataplus)._M_p[sVar13];
      if (wVar2 == L'\0') goto LAB_00169be1;
      cVar11 = (char)&local_d0;
      if (wVar2 < L'\x1b') {
        std::__cxx11::string::push_back(cVar11);
LAB_00169bc8:
        std::__cxx11::string::push_back(cVar11);
      }
      else {
        if ((uint)wVar2 < 0x20) {
          std::__cxx11::string::push_back(cVar11);
          goto LAB_00169bc8;
        }
        if ((((wVar2 & 0x7ffffffbU) == 0x20) || (wVar2 == L'+')) || (wVar2 == L'%'))
        goto LAB_00169bc8;
        if ((uint)wVar2 < 0x2d) {
          std::__cxx11::string::push_back(cVar11);
          goto LAB_00169bc8;
        }
        if ((uint)wVar2 < 0x3a) goto LAB_00169bc8;
        if (wVar2 != L':') {
          if ((uint)wVar2 < 0x40) {
            std::__cxx11::string::push_back(cVar11);
          }
          else {
            if (wVar2 == L'@') goto LAB_00169be1;
            if (0x5a < (uint)wVar2) {
              if ((uint)wVar2 < 0x60) {
                std::__cxx11::string::push_back(cVar11);
              }
              else {
                if (wVar2 == L'`') goto LAB_00169be1;
                if ((uint)wVar2 < 0x7b) {
                  std::__cxx11::string::push_back(cVar11);
                }
                else {
                  if (0x7f < (uint)wVar2) {
                    piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10,"bW");
                    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_70,
                               "Requested content contains a non-encodable character: \'","");
                    std::operator+(&local_50,&local_70,(char)wVar2);
                    plVar9 = (long *)std::__cxx11::string::append((char *)&local_50);
                    local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
                         (_Bit_type *)*plVar9;
                    plVar10 = plVar9 + 2;
                    if (local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p ==
                        (_Bit_type *)plVar10) {
                      local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p =
                           (_Bit_type *)*plVar10;
                      local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._8_8_ = plVar9[3];
                      local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
                           (_Bit_type *)
                           &local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_finish;
                    }
                    else {
                      local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p =
                           (_Bit_type *)*plVar10;
                    }
                    local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._8_8_ = plVar9[1];
                    *plVar9 = (long)plVar10;
                    plVar9[1] = 0;
                    *(undefined1 *)(plVar9 + 2) = 0;
                    std::invalid_argument::invalid_argument(piVar8,(string *)&local_a8);
                    __cxa_throw(piVar8,&std::invalid_argument::typeinfo,
                                std::invalid_argument::~invalid_argument);
                  }
                  std::__cxx11::string::push_back(cVar11);
                }
              }
            }
          }
          goto LAB_00169bc8;
        }
LAB_00169be1:
        std::__cxx11::string::append((char *)&local_d0);
      }
      sVar13 = sVar13 + 1;
    } while (sVar3 != sVar13);
  }
  psVar4 = local_c8;
  if (local_c8 == (string *)0x0) {
    piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar8,"Found empty contents");
  }
  else {
    if (local_c8 < (string *)0x51) {
      local_50._M_dataplus._M_p._0_1_ = 0;
      std::vector<bool,_std::allocator<bool>_>::vector
                (&local_a8,(long)local_c8 * 9 + 0x25,(bool *)&local_50,(allocator_type *)&local_70);
      psVar14 = (string *)0x0;
      AppendPattern((vector<bool,_std::allocator<bool>_> *)
                    local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,0,0x15e);
      uVar12 = 0x24;
      do {
        pos = uVar12;
        pvVar7 = memchr("0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ-. $/+%abcd*",
                        (int)(char)local_d0[(long)psVar14],0x31);
        AppendPattern((vector<bool,_std::allocator<bool>_> *)
                      local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,pos - 0x1b,
                      *(int *)(CHARACTER_ENCODINGS +
                              (-(ulong)(pvVar7 == (void *)0x0) | (long)((int)pvVar7 + -0x197710)) *
                              4));
        psVar14 = (string *)((long)&(psVar14->_M_dataplus)._M_p + 1);
        uVar12 = pos + 9;
      } while (psVar4 != psVar14);
      iVar6 = ComputeChecksumIndex(local_d0,local_c8,0x14);
      AppendPattern((vector<bool,_std::allocator<bool>_> *)
                    local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,pos - 0x12,
                    *(int *)(CHARACTER_ENCODINGS + (long)iVar6 * 4));
      std::__cxx11::string::push_back((char)&local_d0);
      iVar6 = ComputeChecksumIndex(local_d0,local_c8,0xf);
      AppendPattern((vector<bool,_std::allocator<bool>_> *)
                    local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,pos - 9,
                    *(int *)(CHARACTER_ENCODINGS + (long)iVar6 * 4));
      AppendPattern((vector<bool,_std::allocator<bool>_> *)
                    local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,pos,0x15e);
      pBVar5 = local_78;
      pp_Var1 = &(((_Bvector_base<std::allocator<bool>_> *)
                  local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p)->_M_impl).
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + (uVar12 >> 6);
      *pp_Var1 = (_Bit_type *)((ulong)*pp_Var1 | 1L << ((byte)uVar12 & 0x3f));
      iVar6 = 10;
      if (-1 < local_80->_sidesMargin) {
        iVar6 = local_80->_sidesMargin;
      }
      WriterHelper::RenderResult(local_78,&local_a8,local_b0,local_ac,iVar6);
      if ((vector<bool,_std::allocator<bool>_> *)
          local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p != (vector<bool,_std::allocator<bool>_> *)0x0) {
        operator_delete(local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                        (long)local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_end_of_storage -
                        (long)local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      }
      if (local_d0 != &local_c0) {
        operator_delete(local_d0,CONCAT71(uStack_bf,local_c0) + 1);
      }
      return pBVar5;
    }
    piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar8,
               "Requested contents should be less than 80 digits long after converting to extended encoding"
              );
  }
  __cxa_throw(piVar8,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

BitMatrix
Code93Writer::encode(const std::wstring& contents_, int width, int height) const
{
	std::string contents = Code93ConvertToExtended(contents_);

	size_t length = contents.length();
	if (length == 0) {
		throw std::invalid_argument("Found empty contents");
	}
	if (length > 80) {
		throw std::invalid_argument("Requested contents should be less than 80 digits long after converting to extended encoding");
	}

	//length of code + 2 start/stop characters + 2 checksums, each of 9 bits, plus a termination bar
	size_t codeWidth = (contents.length() + 2 + 2) * 9 + 1;

	std::vector<bool> result(codeWidth, false);

	//start character (*)
	int pos = AppendPattern(result, 0, ASTERISK_ENCODING);

	for (size_t i = 0; i < length; i++) {
		int indexInString = IndexOf(ALPHABET, contents[i]);
		pos += AppendPattern(result, pos, CHARACTER_ENCODINGS[indexInString]);
	}

	//add two checksums
	int check1 = ComputeChecksumIndex(contents, 20);
	pos += AppendPattern(result, pos, CHARACTER_ENCODINGS[check1]);

	//append the contents to reflect the first checksum added
	contents += static_cast<wchar_t>(ALPHABET[check1]);

	int check2 = ComputeChecksumIndex(contents, 15);
	pos += AppendPattern(result, pos, CHARACTER_ENCODINGS[check2]);

	//end character (*)
	pos += AppendPattern(result, pos, ASTERISK_ENCODING);

	//termination bar (single black bar)
	result[pos] = true;

	return WriterHelper::RenderResult(result, width, height, _sidesMargin >= 0 ? _sidesMargin : 10);
}